

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Result RVar1;
  int iVar2;
  Enum EVar3;
  char *format;
  uint32_t magic;
  BinaryReader reader;
  uint local_128;
  uint local_124;
  BinaryReader local_120;
  
  local_120.state_.offset = 0;
  local_120.read_end_ = size;
  local_120.state_.data = (uint8_t *)data;
  local_120.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging
            (&local_120.logging_delegate_,options->log_stream,delegate);
  local_120.delegate_ = &local_120.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    local_120.delegate_ = delegate;
  }
  local_120.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.last_known_section_ = Invalid;
  local_120.did_read_names_section_ = false;
  local_120.reading_custom_section_ = false;
  local_120.num_func_imports_ = 0;
  local_120.num_table_imports_ = 0;
  local_120.num_memory_imports_ = 0;
  local_120.num_global_imports_ = 0;
  local_120.num_event_imports_ = 0;
  local_120.num_function_signatures_ = 0;
  local_120.num_function_bodies_ = 0;
  local_120.data_count_ = 0xffffffff;
  local_120.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&local_120.state_);
  local_124 = 0;
  RVar1 = anon_unknown_25::BinaryReader::ReadT<unsigned_int>
                    (&local_120,&local_124,"uint32_t","magic");
  EVar3 = Error;
  if (RVar1.enum_ == Error) goto LAB_0016aec5;
  if (local_124 == 0x6d736100) {
    local_128 = 0;
    RVar1 = anon_unknown_25::BinaryReader::ReadT<unsigned_int>
                      (&local_120,&local_128,"uint32_t","version");
    EVar3 = Error;
    if (RVar1.enum_ == Error) goto LAB_0016aec5;
    if (local_128 != 1) {
      anon_unknown_25::BinaryReader::PrintError
                (&local_120,"bad wasm file version: %#x (expected %#x)",(ulong)local_128,1);
      goto LAB_0016aec5;
    }
    iVar2 = (*(local_120.delegate_)->_vptr_BinaryReaderDelegate[4])(local_120.delegate_,1);
    if (iVar2 == 0) {
      RVar1 = anon_unknown_25::BinaryReader::ReadSections(&local_120);
      if (RVar1.enum_ == Error) goto LAB_0016aec5;
      if (local_120.num_function_signatures_ == local_120.num_function_bodies_) {
        iVar2 = (*(local_120.delegate_)->_vptr_BinaryReaderDelegate[5])();
        if (iVar2 == 0) {
          EVar3 = Ok;
          goto LAB_0016aec5;
        }
        format = "EndModule callback failed";
      }
      else {
        format = "function signature count != function body count";
      }
    }
    else {
      format = "BeginModule callback failed";
    }
  }
  else {
    format = "bad magic value";
  }
  EVar3 = Error;
  anon_unknown_25::BinaryReader::PrintError(&local_120,format);
LAB_0016aec5:
  if (local_120.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.memories.
                    super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_120.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.target_depths_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_120.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.fields_.
                    super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_120.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.result_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_120.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.param_types_.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (Result)EVar3;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule();
}